

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cpp
# Opt level: O0

int __thiscall Stream::advance(Stream *this)

{
  int iVar1;
  long in_RDI;
  int c;
  
  std::istream::get();
  iVar1 = std::istream::peek();
  if (iVar1 == 10) {
    Mark::newLine((Mark *)(in_RDI + 8));
  }
  else {
    Mark::advance((Mark *)(in_RDI + 8));
  }
  return iVar1;
}

Assistant:

int Stream::advance()
{
  is_.get();
  int c = is_.peek();

  if(c == '\n')
    mark_.newLine();
  else 
    mark_.advance();

  return c;
}